

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  unsigned_long_long uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterYs<unsigned_long_long> *pGVar8;
  TransformerLogLog *pTVar9;
  ImPlotPlot *pIVar10;
  GetterYRef *pGVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  int iVar18;
  ImDrawIdx IVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  float fVar24;
  undefined1 auVar23 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  pIVar16 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar18 = pGVar8->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar8->Ys +
           (long)(((prim + pGVar8->Offset) % iVar18 + iVar18) % iVar18) * (long)pGVar8->Stride);
  dVar21 = log10((pGVar8->XScale * (double)prim + pGVar8->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar16->CurrentPlot;
  dVar2 = pIVar16->LogDenX;
  dVar3 = (pIVar10->XAxis).Range.Min;
  dVar4 = (pIVar10->XAxis).Range.Max;
  dVar22 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  pIVar17 = GImPlot;
  iVar18 = pTVar9->YAxis;
  pIVar10 = pIVar16->CurrentPlot;
  auVar32._8_8_ = pIVar16->LogDenY[iVar18];
  auVar32._0_8_ = dVar2;
  pGVar11 = this->Getter2;
  pTVar9 = this->Transformer;
  auVar28._8_8_ = dVar22;
  auVar28._0_8_ = dVar21;
  dVar2 = pGVar11->YRef;
  auVar29 = divpd(auVar28,auVar32);
  dVar21 = pIVar10->YAxis[iVar18].Range.Min;
  IVar5 = pIVar16->PixelRange[iVar18].Min;
  fVar25 = (float)(pIVar16->Mx *
                   (((double)(float)auVar29._0_8_ * (dVar4 - dVar3) + dVar3) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar5.x);
  fVar26 = (float)(pIVar16->My[iVar18] *
                   (((double)(float)auVar29._8_8_ * (pIVar10->YAxis[iVar18].Range.Max - dVar21) +
                    dVar21) - dVar21) + (double)IVar5.y);
  dVar22 = log10(((double)prim * pGVar11->XScale + pGVar11->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar17->CurrentPlot;
  dVar3 = pIVar17->LogDenX;
  dVar4 = (pIVar10->XAxis).Range.Min;
  dVar21 = (pIVar10->XAxis).Range.Max;
  auVar23._0_8_ = log10(dVar2 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  iVar18 = pTVar9->YAxis;
  auVar23._8_8_ = dVar22;
  auVar14._8_4_ = SUB84(dVar3,0);
  auVar14._0_8_ = pIVar17->LogDenY[iVar18];
  auVar14._12_4_ = (int)((ulong)dVar3 >> 0x20);
  auVar29 = divpd(auVar23,auVar14);
  pIVar10 = pIVar17->CurrentPlot;
  dVar2 = pIVar10->YAxis[iVar18].Range.Min;
  IVar5 = pIVar17->PixelRange[iVar18].Min;
  fVar20 = (float)(pIVar17->My[iVar18] *
                   (((double)(float)auVar29._0_8_ * (pIVar10->YAxis[iVar18].Range.Max - dVar2) +
                    dVar2) - dVar2) + (double)IVar5.y);
  fVar24 = (float)(pIVar17->Mx *
                   (((double)(float)auVar29._8_8_ * (dVar21 - dVar4) + dVar4) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar5.x);
  auVar33._0_4_ = ~-(uint)(fVar24 <= fVar25) & (uint)fVar24;
  auVar33._4_4_ = ~-(uint)(fVar20 <= fVar26) & (uint)fVar20;
  auVar33._8_4_ = ~-(uint)(fVar25 < fVar24) & (uint)fVar24;
  auVar33._12_4_ = ~-(uint)(fVar26 < fVar20) & (uint)fVar20;
  auVar29._4_4_ = (uint)fVar26 & -(uint)(fVar20 <= fVar26);
  auVar29._0_4_ = (uint)fVar25 & -(uint)(fVar24 <= fVar25);
  auVar29._8_4_ = (uint)fVar25 & -(uint)(fVar25 < fVar24);
  auVar29._12_4_ = (uint)fVar26 & -(uint)(fVar26 < fVar20);
  auVar33 = auVar33 | auVar29;
  fVar27 = (cull_rect->Min).y;
  auVar15._4_8_ = auVar33._8_8_;
  auVar15._0_4_ = -(uint)(auVar33._4_4_ < fVar27);
  auVar34._0_8_ = auVar15._0_8_ << 0x20;
  auVar34._8_4_ = -(uint)(auVar33._8_4_ < (cull_rect->Max).x);
  auVar34._12_4_ = -(uint)(auVar33._12_4_ < (cull_rect->Max).y);
  auVar35._4_4_ = -(uint)(fVar27 < auVar33._4_4_);
  auVar35._0_4_ = -(uint)((cull_rect->Min).x < auVar33._0_4_);
  auVar35._8_8_ = auVar34._8_8_;
  iVar18 = movmskps(iVar18 * 0x10,auVar35);
  if (iVar18 == 0xf) {
    IVar6 = this->Col;
    IVar5 = *uv;
    fVar27 = fVar20 - fVar26;
    fVar30 = fVar24 - fVar25;
    fVar31 = fVar30 * fVar30 + fVar27 * fVar27;
    if (0.0 < fVar31) {
      fVar31 = 1.0 / SQRT(fVar31);
      fVar27 = fVar27 * fVar31;
      fVar30 = fVar30 * fVar31;
    }
    fVar31 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    fVar27 = fVar31 * fVar27;
    fVar31 = fVar31 * fVar30;
    (pIVar12->pos).x = fVar27 + fVar25;
    (pIVar12->pos).y = fVar26 - fVar31;
    (pIVar12->uv).x = IVar5.x;
    (pIVar12->uv).y = IVar5.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar6;
    pIVar12[1].pos.x = fVar27 + fVar24;
    pIVar12[1].pos.y = fVar20 - fVar31;
    pIVar12[1].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar6;
    pIVar12[2].pos.x = fVar24 - fVar27;
    pIVar12[2].pos.y = fVar31 + fVar20;
    pIVar12[2].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar6;
    pIVar12[3].pos.x = fVar25 - fVar27;
    pIVar12[3].pos.y = fVar31 + fVar26;
    pIVar12[3].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar7;
    *pIVar13 = IVar19;
    pIVar13[1] = IVar19 + 1;
    pIVar13[2] = IVar19 + 2;
    pIVar13[3] = IVar19;
    pIVar13[4] = IVar19 + 2;
    pIVar13[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }